

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O3

bool __thiscall QProcessPrivate::_q_canWrite(QProcessPrivate *this)

{
  QRingBuffer *pQVar1;
  bool bVar2;
  QSocketNotifier *this_00;
  bool enable;
  
  pQVar1 = (this->super_QIODevicePrivate).writeBuffer.m_buf;
  if ((pQVar1 == (QRingBuffer *)0x0) || (pQVar1->bufferSize == 0)) {
    this_00 = (this->stdinChannel).notifier;
    bVar2 = false;
    if (this_00 == (QSocketNotifier *)0x0) {
      return false;
    }
    enable = false;
  }
  else {
    bVar2 = writeToStdin(this);
    pQVar1 = (this->super_QIODevicePrivate).writeBuffer.m_buf;
    if ((pQVar1 == (QRingBuffer *)0x0) || (pQVar1->bufferSize == 0)) {
      if ((this->stdinChannel).closed == true) {
        closeWriteChannel(this);
        return bVar2;
      }
      this_00 = (this->stdinChannel).notifier;
      if (this_00 == (QSocketNotifier *)0x0) {
        return bVar2;
      }
      if (pQVar1 == (QRingBuffer *)0x0) {
        enable = false;
      }
      else {
        enable = pQVar1->bufferSize != 0;
      }
    }
    else {
      this_00 = (this->stdinChannel).notifier;
      enable = true;
      if (this_00 == (QSocketNotifier *)0x0) {
        return bVar2;
      }
    }
  }
  QSocketNotifier::setEnabled(this_00,enable);
  return bVar2;
}

Assistant:

bool QProcessPrivate::_q_canWrite()
{
    if (writeBuffer.isEmpty()) {
        if (stdinChannel.notifier)
            stdinChannel.notifier->setEnabled(false);
#if defined QPROCESS_DEBUG
        qDebug("QProcessPrivate::canWrite(), not writing anything (empty write buffer).");
#endif
        return false;
    }

    const bool writeSucceeded = writeToStdin();

    if (writeBuffer.isEmpty() && stdinChannel.closed)
        closeWriteChannel();
    else if (stdinChannel.notifier)
        stdinChannel.notifier->setEnabled(!writeBuffer.isEmpty());

    return writeSucceeded;
}